

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::StrNotInHelper::Assertion<char[4],char[5]>
          (AssertionResult *__return_storage_ptr__,StrNotInHelper *this,char *substr_str,
          char *actual_str,char (*substr) [4],char (*actual) [5])

{
  bool bVar1;
  AssertionResult *pAVar2;
  char *local_50;
  StrNotInHelper *local_48;
  AssertionResult local_40;
  
  local_50 = substr_str;
  local_48 = this;
  bVar1 = Compare<char[4],char[5]>((char (*) [4])actual_str,(char (*) [5])substr);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_40.m_message._M_dataplus._M_p = (pointer)&local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    pAVar2 = iutest::AssertionResult::operator<<(&local_40,(char (*) [18])"error: Expected: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [8])"strstr(");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_50);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [3])0x16fb09);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)&local_48);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [10])") == NULL");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])"\n  Actual: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [9])"strstr(\"");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [5])substr);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [4])"\", ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [4])actual_str);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [10])") != NULL");
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(const char* substr_str, const char* actual_str
    , const T1& substr, const T2& actual)
{
    if( Compare(substr, actual) )
    {
        return ::iutest::AssertionSuccess();
    }

    return ::iutest::AssertionFailure() << "error: Expected: " << "strstr(" << actual_str << ", " << substr_str << ") == NULL"
        << "\n  Actual: " << "strstr(\"" << actual << "\", " << substr << ") != NULL";
}